

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
anon_unknown.dwarf_172d80::spvTextEncodeOpcode
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_instruction_t *pInst)

{
  spv_operand_type_t type_00;
  char cVar1;
  bool bVar2;
  spv_result_t sVar3;
  int32_t iVar4;
  uint32_t uVar5;
  DiagnosticStream *pDVar6;
  char *pcVar7;
  spv_position_t *psVar8;
  long lVar9;
  ulong uVar10;
  reference pvVar11;
  size_type sVar12;
  reference pvVar13;
  int local_1b2c;
  size_type local_1b28;
  DiagnosticStream local_1b20;
  DiagnosticStream local_1948;
  undefined1 local_1770 [8];
  string operandValue;
  DiagnosticStream local_1578;
  undefined1 local_13a0 [8];
  spv_position_t temp_pos;
  spv_operand_type_t type;
  int i;
  spv_operand_pattern_t expectedOperands;
  DiagnosticStream local_1190;
  DiagnosticStream local_fb8;
  spv_opcode_desc local_de0;
  spv_opcode_desc opcodeEntry;
  char *pInstName;
  DiagnosticStream local_bf8;
  DiagnosticStream local_a20;
  DiagnosticStream local_848;
  undefined1 local_670 [8];
  string equal_sign;
  DiagnosticStream local_478;
  size_t local_2a0;
  spv_position_t result_id_position;
  string result_id;
  string opcodeName;
  DiagnosticStream local_240;
  spv_result_t local_64;
  undefined1 local_60 [4];
  spv_result_t error;
  spv_position_t nextPosition;
  string firstWord;
  spv_instruction_t *pInst_local;
  AssemblyContext *context_local;
  AssemblyGrammar *grammar_local;
  
  cVar1 = spvtools::AssemblyContext::peek(context);
  if (cVar1 == '!') {
    sVar3 = encodeInstructionStartingWithImmediate(grammar,context,pInst);
    return sVar3;
  }
  std::__cxx11::string::string((string *)&nextPosition.index);
  memset(local_60,0,0x18);
  local_64 = spvtools::AssemblyContext::getWord
                       (context,(string *)&nextPosition.index,(spv_position)local_60);
  if (local_64 != SPV_SUCCESS) {
    spvtools::AssemblyContext::diagnostic(&local_240,context);
    pDVar6 = spvtools::DiagnosticStream::operator<<(&local_240,(char (*) [15])"Internal Error");
    grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_240);
    goto LAB_00206a47;
  }
  std::__cxx11::string::string((string *)(result_id.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&result_id_position.index);
  memset(&local_2a0,0,0x18);
  bVar2 = spvtools::AssemblyContext::startsWithOp(context);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)(result_id.field_2._M_local_buf + 8),(string *)&nextPosition.index);
LAB_002061c2:
    lVar9 = std::__cxx11::string::data();
    opcodeEntry = (spv_opcode_desc)(lVar9 + 2);
    local_64 = spvtools::AssemblyGrammar::lookupOpcode(grammar,(char *)opcodeEntry,&local_de0);
    if (local_64 == SPV_SUCCESS) {
      if (((local_de0->hasResult & 1U) == 0) ||
         (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
        if (((local_de0->hasResult & 1U) != 0) ||
           (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
          pInst->opcode = local_de0->opcode;
          spvtools::AssemblyContext::setPosition(context,(spv_position_t *)local_60);
          spvInstructionAddWord(pInst,0);
          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
                    ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)&type);
          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
                    ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)&type,
                     (ulong)local_de0->numTypes);
          for (temp_pos.index._4_4_ = 0; temp_pos.index._4_4_ < (int)(uint)local_de0->numTypes;
              temp_pos.index._4_4_ = temp_pos.index._4_4_ + 1) {
            std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                      ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)&type,
                       local_de0->operandTypes +
                       (int)(((uint)local_de0->numTypes - temp_pos.index._4_4_) + -1));
          }
LAB_00206443:
          bVar2 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::empty
                            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                             &type);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pvVar11 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::back
                                ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                                 &type);
            temp_pos.index._0_4_ = *pvVar11;
            std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::pop_back
                      ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)&type);
            bVar2 = spvExpandOperandSequenceOnce
                              ((value_type)temp_pos.index,(spv_operand_pattern_t *)&type);
            if (bVar2) goto LAB_00206443;
            if (((value_type)temp_pos.index == SPV_OPERAND_TYPE_RESULT_ID) &&
               (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
              psVar8 = spvtools::AssemblyContext::position(context);
              local_13a0 = (undefined1  [8])psVar8->line;
              temp_pos.line = psVar8->column;
              temp_pos.column = psVar8->index;
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_64 = spvTextEncodeOperand
                                   (grammar,context,SPV_OPERAND_TYPE_RESULT_ID,pcVar7,pInst,
                                    (spv_operand_pattern_t *)0x0);
              psVar8 = spvtools::AssemblyContext::position(context);
              local_2a0 = psVar8->line;
              result_id_position.line = psVar8->column;
              result_id_position.column = psVar8->index;
              spvtools::AssemblyContext::setPosition(context,(spv_position_t *)local_13a0);
              if (local_64 != SPV_SUCCESS) goto code_r0x00206566;
              goto LAB_00206443;
            }
            local_64 = spvtools::AssemblyContext::advance(context);
            if (local_64 != SPV_END_OF_STREAM) {
              if (local_64 != SPV_SUCCESS) {
                __assert_fail("error == SPV_SUCCESS && \"Somebody added another way to fail\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                              ,0x284,
                              "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                             );
              }
              bVar2 = spvtools::AssemblyContext::isStartOfNewInst(context);
              if (bVar2) {
                bVar2 = spvOperandIsOptional((value_type)temp_pos.index);
                if (bVar2) goto LAB_00206829;
                spvtools::AssemblyContext::diagnostic
                          ((DiagnosticStream *)((long)&operandValue.field_2 + 8),context);
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   ((DiagnosticStream *)((long)&operandValue.field_2 + 8),
                                    (char (*) [22])"Expected operand for ");
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&result_id.field_2 + 8));
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   (pDVar6,(char (*) [54])
                                           " instruction, but found the next instruction instead.");
                grammar_local._4_4_ =
                     spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                spvtools::DiagnosticStream::~DiagnosticStream
                          ((DiagnosticStream *)((long)&operandValue.field_2 + 8));
                goto LAB_00206a23;
              }
              std::__cxx11::string::string((string *)local_1770);
              local_64 = spvtools::AssemblyContext::getWord
                                   (context,(string *)local_1770,(spv_position)local_60);
              type_00 = (value_type)temp_pos.index;
              if (local_64 == SPV_SUCCESS) {
                pcVar7 = (char *)std::__cxx11::string::c_str();
                local_64 = spvTextEncodeOperand
                                     (grammar,context,type_00,pcVar7,pInst,
                                      (spv_operand_pattern_t *)&type);
                if ((local_64 == SPV_FAILED_MATCH) &&
                   (bVar2 = spvOperandIsOptional((value_type)temp_pos.index), bVar2)) {
                  grammar_local._4_4_ = SPV_SUCCESS;
                  bVar2 = true;
                }
                else if (local_64 == SPV_SUCCESS) {
                  spvtools::AssemblyContext::setPosition(context,(spv_position_t *)local_60);
                  bVar2 = false;
                }
                else {
                  grammar_local._4_4_ = local_64;
                  bVar2 = true;
                }
              }
              else {
                spvtools::AssemblyContext::diagnostic(&local_1948,context,local_64);
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   (&local_1948,(char (*) [15])"Internal Error");
                grammar_local._4_4_ =
                     spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                spvtools::DiagnosticStream::~DiagnosticStream(&local_1948);
                bVar2 = true;
              }
              std::__cxx11::string::~string((string *)local_1770);
              if (bVar2) goto LAB_00206a23;
              goto LAB_00206443;
            }
            bVar2 = spvOperandIsOptional((value_type)temp_pos.index);
            if (!bVar2) {
              spvtools::AssemblyContext::diagnostic(&local_1578,context);
              pDVar6 = spvtools::DiagnosticStream::operator<<
                                 (&local_1578,(char (*) [22])"Expected operand for ");
              pDVar6 = spvtools::DiagnosticStream::operator<<
                                 (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&result_id.field_2 + 8));
              pDVar6 = spvtools::DiagnosticStream::operator<<
                                 (pDVar6,(char (*) [47])
                                         " instruction, but found the end of the stream.");
              grammar_local._4_4_ =
                   spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              spvtools::DiagnosticStream::~DiagnosticStream(&local_1578);
              goto LAB_00206a23;
            }
          }
LAB_00206829:
          iVar4 = spvOpcodeGeneratesType(pInst->opcode);
          if (iVar4 == 0) {
            if ((local_de0->hasType & 1U) != 0) {
              if ((local_de0->hasResult & 1U) == 0) {
                __assert_fail("opcodeEntry->hasResult && \"Unknown opcode: has a type but no result.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                              ,0x2a8,
                              "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                             );
              }
              pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&pInst->words,2);
              uVar5 = *pvVar13;
              pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&pInst->words,1);
              spvtools::AssemblyContext::recordTypeIdForValue(context,uVar5,*pvVar13);
            }
          }
          else {
            sVar3 = spvtools::AssemblyContext::recordTypeDefinition(context,pInst);
            if (sVar3 != SPV_SUCCESS) {
              grammar_local._4_4_ = SPV_ERROR_INVALID_TEXT;
              goto LAB_00206a23;
            }
          }
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pInst->words);
          if (sVar12 < 0x10000) {
            sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pInst->words);
            uVar5 = spvOpcodeMake((uint16_t)sVar12,local_de0->opcode);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&pInst->words,0);
            *pvVar13 = uVar5;
            grammar_local._4_4_ = SPV_SUCCESS;
          }
          else {
            spvtools::AssemblyContext::diagnostic(&local_1b20,context);
            pDVar6 = spvtools::DiagnosticStream::operator<<
                               (&local_1b20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&result_id.field_2 + 8));
            pDVar6 = spvtools::DiagnosticStream::operator<<
                               (pDVar6,(char (*) [24])" Instruction too long: ");
            local_1b28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   (&pInst->words);
            pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,&local_1b28);
            pDVar6 = spvtools::DiagnosticStream::operator<<
                               (pDVar6,(char (*) [26])" words, but the limit is ");
            local_1b2c = 0xffff;
            pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,&local_1b2c);
            grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            spvtools::DiagnosticStream::~DiagnosticStream(&local_1b20);
          }
          goto LAB_00206a23;
        }
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)
                   &expectedOperands.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,context);
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           ((DiagnosticStream *)
                            &expectedOperands.
                             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (char (*) [15])"Cannot set ID ");
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&result_id_position.index);
        pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [10])" because ");
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&result_id.field_2 + 8));
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           (pDVar6,(char (*) [31])" does not produce a result ID.");
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        spvtools::DiagnosticStream::~DiagnosticStream
                  ((DiagnosticStream *)
                   &expectedOperands.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        spvtools::AssemblyContext::diagnostic(&local_1190,context);
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           (&local_1190,
                            (char (*) [65])
                            "Expected <result-id> at the beginning of an instruction, found \'");
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&nextPosition.index);
        pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [3])"\'.");
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        spvtools::DiagnosticStream::~DiagnosticStream(&local_1190);
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_fb8,context,local_64);
      pDVar6 = spvtools::DiagnosticStream::operator<<
                         (&local_fb8,(char (*) [22])"Invalid Opcode name \'");
      pDVar6 = spvtools::DiagnosticStream::operator<<
                         (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&result_id.field_2 + 8));
      pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [2])0x634f11);
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_fb8);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&result_id_position.index,(string *)&nextPosition.index);
    pcVar7 = (char *)std::__cxx11::string::front();
    if (*pcVar7 == '%') {
      psVar8 = spvtools::AssemblyContext::position(context);
      local_2a0 = psVar8->line;
      result_id_position.line = psVar8->column;
      result_id_position.column = psVar8->index;
      spvtools::AssemblyContext::setPosition(context,(spv_position_t *)local_60);
      sVar3 = spvtools::AssemblyContext::advance(context);
      if (sVar3 == SPV_SUCCESS) {
        std::__cxx11::string::string((string *)local_670);
        local_64 = spvtools::AssemblyContext::getWord
                             (context,(string *)local_670,(spv_position)local_60);
        bVar2 = std::operator!=("=",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_670);
        if (bVar2) {
          spvtools::AssemblyContext::diagnostic(&local_848,context);
          pDVar6 = spvtools::DiagnosticStream::operator<<
                             (&local_848,
                              (char (*) [41])"\'=\' expected after result id but found \'");
          pDVar6 = spvtools::DiagnosticStream::operator<<
                             (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_670);
          pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [3])"\'.");
          grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          spvtools::DiagnosticStream::~DiagnosticStream(&local_848);
          bVar2 = true;
        }
        else {
          spvtools::AssemblyContext::setPosition(context,(spv_position_t *)local_60);
          sVar3 = spvtools::AssemblyContext::advance(context);
          if (sVar3 == SPV_SUCCESS) {
            local_64 = spvtools::AssemblyContext::getWord
                                 (context,(string *)((long)&result_id.field_2 + 8),
                                  (spv_position)local_60);
            if (local_64 == SPV_SUCCESS) {
              bVar2 = spvtools::AssemblyContext::startsWithOp(context);
              if (bVar2) {
                bVar2 = false;
              }
              else {
                spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&pInstName,context);
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&pInstName,
                                    (char (*) [24])"Invalid Opcode prefix \'");
                pDVar6 = spvtools::DiagnosticStream::operator<<
                                   (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&result_id.field_2 + 8));
                pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [3])"\'.");
                grammar_local._4_4_ =
                     spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&pInstName);
                bVar2 = true;
              }
            }
            else {
              spvtools::AssemblyContext::diagnostic(&local_bf8,context,local_64);
              pDVar6 = spvtools::DiagnosticStream::operator<<
                                 (&local_bf8,(char (*) [15])"Internal Error");
              grammar_local._4_4_ =
                   spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              spvtools::DiagnosticStream::~DiagnosticStream(&local_bf8);
              bVar2 = true;
            }
          }
          else {
            spvtools::AssemblyContext::diagnostic(&local_a20,context);
            pDVar6 = spvtools::DiagnosticStream::operator<<
                               (&local_a20,(char (*) [38])"Expected opcode, found end of stream.");
            grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            spvtools::DiagnosticStream::~DiagnosticStream(&local_a20);
            bVar2 = true;
          }
        }
        std::__cxx11::string::~string((string *)local_670);
        if (!bVar2) goto LAB_002061c2;
      }
      else {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)((long)&equal_sign.field_2 + 8),context);
        pDVar6 = spvtools::DiagnosticStream::operator<<
                           ((DiagnosticStream *)((long)&equal_sign.field_2 + 8),
                            (char (*) [35])"Expected \'=\', found end of stream.");
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        spvtools::DiagnosticStream::~DiagnosticStream
                  ((DiagnosticStream *)((long)&equal_sign.field_2 + 8));
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_478,context);
      pDVar6 = spvtools::DiagnosticStream::operator<<
                         (&local_478,
                          (char (*) [77])
                          "Expected <opcode> or <result-id> at the beginning of an instruction, found \'"
                         );
      pDVar6 = spvtools::DiagnosticStream::operator<<
                         (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&result_id_position.index);
      pDVar6 = spvtools::DiagnosticStream::operator<<(pDVar6,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_478);
    }
  }
  goto LAB_00206a2f;
code_r0x00206566:
  grammar_local._4_4_ = local_64;
LAB_00206a23:
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::~vector
            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)&type);
LAB_00206a2f:
  std::__cxx11::string::~string((string *)&result_id_position.index);
  std::__cxx11::string::~string((string *)(result_id.field_2._M_local_buf + 8));
LAB_00206a47:
  std::__cxx11::string::~string((string *)&nextPosition.index);
  return grammar_local._4_4_;
}

Assistant:

spv_result_t spvTextEncodeOpcode(const spvtools::AssemblyGrammar& grammar,
                                 spvtools::AssemblyContext* context,
                                 spv_instruction_t* pInst) {
  // Check for !<integer> first.
  if ('!' == context->peek()) {
    return encodeInstructionStartingWithImmediate(grammar, context, pInst);
  }

  std::string firstWord;
  spv_position_t nextPosition = {};
  spv_result_t error = context->getWord(&firstWord, &nextPosition);
  if (error) return context->diagnostic() << "Internal Error";

  std::string opcodeName;
  std::string result_id;
  spv_position_t result_id_position = {};
  if (context->startsWithOp()) {
    opcodeName = firstWord;
  } else {
    result_id = firstWord;
    if ('%' != result_id.front()) {
      return context->diagnostic()
             << "Expected <opcode> or <result-id> at the beginning "
                "of an instruction, found '"
             << result_id << "'.";
    }
    result_id_position = context->position();

    // The '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected '=', found end of stream.";
    std::string equal_sign;
    error = context->getWord(&equal_sign, &nextPosition);
    if ("=" != equal_sign)
      return context->diagnostic() << "'=' expected after result id but found '"
                                   << equal_sign << "'.";

    // The <opcode> after the '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected opcode, found end of stream.";
    error = context->getWord(&opcodeName, &nextPosition);
    if (error) return context->diagnostic(error) << "Internal Error";
    if (!context->startsWithOp()) {
      return context->diagnostic()
             << "Invalid Opcode prefix '" << opcodeName << "'.";
    }
  }

  // NOTE: The table contains Opcode names without the "Op" prefix.
  const char* pInstName = opcodeName.data() + 2;

  spv_opcode_desc opcodeEntry;
  error = grammar.lookupOpcode(pInstName, &opcodeEntry);
  if (error) {
    return context->diagnostic(error)
           << "Invalid Opcode name '" << opcodeName << "'";
  }
  if (opcodeEntry->hasResult && result_id.empty()) {
    return context->diagnostic()
           << "Expected <result-id> at the beginning of an instruction, found '"
           << firstWord << "'.";
  }
  if (!opcodeEntry->hasResult && !result_id.empty()) {
    return context->diagnostic()
           << "Cannot set ID " << result_id << " because " << opcodeName
           << " does not produce a result ID.";
  }
  pInst->opcode = opcodeEntry->opcode;
  context->setPosition(nextPosition);
  // Reserve the first word for the instruction.
  spvInstructionAddWord(pInst, 0);

  // Maintains the ordered list of expected operand types.
  // For many instructions we only need the {numTypes, operandTypes}
  // entries in opcodeEntry.  However, sometimes we need to modify
  // the list as we parse the operands. This occurs when an operand
  // has its own logical operands (such as the LocalSize operand for
  // ExecutionMode), or for extended instructions that may have their
  // own operands depending on the selected extended instruction.
  spv_operand_pattern_t expectedOperands;
  expectedOperands.reserve(opcodeEntry->numTypes);
  for (auto i = 0; i < opcodeEntry->numTypes; i++)
    expectedOperands.push_back(
        opcodeEntry->operandTypes[opcodeEntry->numTypes - i - 1]);

  while (!expectedOperands.empty()) {
    const spv_operand_type_t type = expectedOperands.back();
    expectedOperands.pop_back();

    // Expand optional tuples lazily.
    if (spvExpandOperandSequenceOnce(type, &expectedOperands)) continue;

    if (type == SPV_OPERAND_TYPE_RESULT_ID && !result_id.empty()) {
      // Handle the <result-id> for value generating instructions.
      // We've already consumed it from the text stream.  Here
      // we inject its words into the instruction.
      spv_position_t temp_pos = context->position();
      error = spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_RESULT_ID,
                                   result_id.c_str(), pInst, nullptr);
      result_id_position = context->position();
      // Because we are injecting we have to reset the position afterwards.
      context->setPosition(temp_pos);
      if (error) return error;
    } else {
      // Find the next word.
      error = context->advance();
      if (error == SPV_END_OF_STREAM) {
        if (spvOperandIsOptional(type)) {
          // This would have been the last potential operand for the
          // instruction,
          // and we didn't find one.  We're finished parsing this instruction.
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the end of the stream.";
        }
      }
      assert(error == SPV_SUCCESS && "Somebody added another way to fail");

      if (context->isStartOfNewInst()) {
        if (spvOperandIsOptional(type)) {
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the next instruction instead.";
        }
      }

      std::string operandValue;
      error = context->getWord(&operandValue, &nextPosition);
      if (error) return context->diagnostic(error) << "Internal Error";

      error = spvTextEncodeOperand(grammar, context, type, operandValue.c_str(),
                                   pInst, &expectedOperands);

      if (error == SPV_FAILED_MATCH && spvOperandIsOptional(type))
        return SPV_SUCCESS;

      if (error) return error;

      context->setPosition(nextPosition);
    }
  }

  if (spvOpcodeGeneratesType(pInst->opcode)) {
    if (context->recordTypeDefinition(pInst) != SPV_SUCCESS) {
      return SPV_ERROR_INVALID_TEXT;
    }
  } else if (opcodeEntry->hasType) {
    // SPIR-V dictates that if an instruction has both a return value and a
    // type ID then the type id is first, and the return value is second.
    assert(opcodeEntry->hasResult &&
           "Unknown opcode: has a type but no result.");
    context->recordTypeIdForValue(pInst->words[2], pInst->words[1]);
  }

  if (pInst->words.size() > SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX) {
    return context->diagnostic()
           << opcodeName << " Instruction too long: " << pInst->words.size()
           << " words, but the limit is "
           << SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX;
  }

  pInst->words[0] =
      spvOpcodeMake(uint16_t(pInst->words.size()), opcodeEntry->opcode);

  return SPV_SUCCESS;
}